

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QFileSystemTreeView.cpp
# Opt level: O2

void __thiscall QFileSystemTreeView::setVisibleSections(QFileSystemTreeView *this,Sections sections)

{
  bool bVar1;
  int iVar2;
  anon_class_8_1_8991fb9c setSectionHidden;
  anon_class_8_1_8991fb9c resizeSection;
  
  setSectionHidden.this = this;
  resizeSection.this = this;
  if (sections.i == 0) {
    setVisibleSections::anon_class_8_1_8991fb9c::operator()(&setSectionHidden,Name,false);
    setVisibleSections::anon_class_8_1_8991fb9c::operator()(&setSectionHidden,Size,false);
    setVisibleSections::anon_class_8_1_8991fb9c::operator()(&setSectionHidden,Type,false);
  }
  else {
    setVisibleSections::anon_class_8_1_8991fb9c::operator()
              (&setSectionHidden,Name,(sections.i & 1U) == 0);
    setVisibleSections::anon_class_8_1_8991fb9c::operator()
              (&setSectionHidden,Size,(sections.i & 2U) == 0);
    setVisibleSections::anon_class_8_1_8991fb9c::operator()
              (&setSectionHidden,Type,(sections.i & 4U) == 0);
  }
  setVisibleSections::anon_class_8_1_8991fb9c::operator()
            (&setSectionHidden,LastModification,sections.i != 0 && (sections.i & 8U) == 0);
  bVar1 = (bool)QTreeView::header();
  iVar2 = QTreeView::header();
  QHeaderView::isSectionHidden(iVar2);
  QHeaderView::setStretchLastSection(bVar1);
  QTreeView::header();
  iVar2 = QHeaderView::defaultSectionSize();
  setVisibleSections::anon_class_8_1_8991fb9c::operator()(&resizeSection,Name,iVar2);
  QTreeView::header();
  iVar2 = QHeaderView::defaultSectionSize();
  setVisibleSections::anon_class_8_1_8991fb9c::operator()(&resizeSection,Size,iVar2);
  QTreeView::header();
  iVar2 = QHeaderView::defaultSectionSize();
  setVisibleSections::anon_class_8_1_8991fb9c::operator()(&resizeSection,Type,iVar2);
  QTreeView::header();
  iVar2 = QHeaderView::defaultSectionSize();
  setVisibleSections::anon_class_8_1_8991fb9c::operator()(&resizeSection,LastModification,iVar2);
  return;
}

Assistant:

void QFileSystemTreeView::setVisibleSections(QFileSystemTreeView::Sections sections) {
    const auto isSectionHidden = [this](QFileSystemTreeView::Column column) {
        return header()->isSectionHidden(static_cast<int>(column));
    };
    const auto setSectionHidden = [this](QFileSystemTreeView::Column column, bool hidden) {
        header()->setSectionHidden(static_cast<int>(column), hidden);
    };
    const auto resizeSection = [this](QFileSystemTreeView::Column column, int size) {
        header()->resizeSection(static_cast<int>(column), size);
    };

    if (sections == Sections(QFileSystemTreeView::Section::All)) {
        setSectionHidden(QFileSystemTreeView::Column::Name, false);
        setSectionHidden(QFileSystemTreeView::Column::Size, false);
        setSectionHidden(QFileSystemTreeView::Column::Type, false);
        setSectionHidden(QFileSystemTreeView::Column::LastModification, false);
    } else {
        setSectionHidden(QFileSystemTreeView::Column::Name, !sections.testFlag(QFileSystemTreeView::Section::Name));
        setSectionHidden(QFileSystemTreeView::Column::Size, !sections.testFlag(QFileSystemTreeView::Section::Size));
        setSectionHidden(QFileSystemTreeView::Column::Type, !sections.testFlag(QFileSystemTreeView::Section::Type));
        setSectionHidden(QFileSystemTreeView::Column::LastModification,
                         !sections.testFlag(QFileSystemTreeView::Section::LastModification));
    }

    header()->setStretchLastSection(isSectionHidden(QFileSystemTreeView::Column::Name));
    resizeSection(QFileSystemTreeView::Column::Name, header()->defaultSectionSize());
    resizeSection(QFileSystemTreeView::Column::Size, header()->defaultSectionSize());
    resizeSection(QFileSystemTreeView::Column::Type, header()->defaultSectionSize());
    resizeSection(QFileSystemTreeView::Column::LastModification, header()->defaultSectionSize());
}